

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::
ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
                *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  int opcode;
  LogicalExpr LVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_18.field_1.values_ = (Value *)&local_28;
  this_00 = this->reader_;
  pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
  (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    ReadConstant(this,*pcVar1);
    return 0;
  default:
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)0x2628ce,&local_18);
  case 'o':
    opcode = ReadOpCode(this);
    LVar2 = ReadLogicalExpr(this,opcode);
    return LVar2;
  }
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}